

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

int ncnn::gemm_BT_x86(Mat *A,Mat *BT,Mat *C,Mat *top_blob,int broadcast_type_C,int N,int K,
                     int transA,int output_transpose,int constant_TILE_M,int constant_TILE_N,
                     int constant_TILE_K,int nT,Option *opt)

{
  int *piVar1;
  void **in_RDX;
  Mat *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_00000038;
  long in_stack_00000040;
  bool k_end;
  Mat BT_tile;
  undefined1 in_stack_0000023b;
  int in_stack_0000023c;
  Mat *in_stack_00000240;
  Mat *in_stack_00000248;
  Mat *in_stack_00000250;
  Mat *in_stack_00000258;
  Mat *in_stack_00000260;
  Mat AT_tile;
  int max_kk;
  int k;
  Mat *CT_tile;
  int max_jj;
  int j;
  Mat topT_tile;
  int max_ii;
  int K_1;
  int M_1;
  int i;
  int ppi;
  Mat topT;
  Mat ATX;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int M;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  int in_stack_00003df0;
  int in_stack_00003df8;
  int in_stack_00003e00;
  int in_stack_00003e08;
  int in_stack_00003e10;
  int in_stack_00003e18;
  undefined4 in_stack_fffffffffffff704;
  undefined4 in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff70c;
  int in_stack_fffffffffffff714;
  int in_stack_fffffffffffff718;
  int in_stack_fffffffffffff71c;
  Mat *in_stack_fffffffffffff720;
  undefined8 in_stack_fffffffffffff760;
  void **ppvVar2;
  int in_stack_fffffffffffff768;
  int in_stack_fffffffffffff76c;
  int in_stack_fffffffffffff770;
  int in_stack_fffffffffffff774;
  void **in_stack_fffffffffffff780;
  int *in_stack_fffffffffffff788;
  Mat *in_stack_fffffffffffff790;
  Mat *in_stack_fffffffffffff798;
  undefined8 *in_stack_fffffffffffff7a0;
  int k_00;
  void **in_stack_fffffffffffff7a8;
  int i_00;
  Mat *in_stack_fffffffffffff7b0;
  Mat *in_stack_fffffffffffff7b8;
  void **local_830;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  int local_7d0;
  bool local_795;
  int local_794;
  int local_790;
  Mat local_788;
  void *local_740;
  int *local_738;
  size_t local_730;
  int local_728;
  Allocator *local_720;
  undefined4 local_718;
  int local_714;
  undefined4 local_710;
  undefined4 local_70c;
  undefined4 local_708;
  long local_700;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined4 local_6e0;
  Allocator *local_6d8;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined8 local_6b8;
  void *local_6b0;
  int *local_6a8;
  size_t local_6a0;
  int local_698;
  Allocator *local_690;
  undefined4 local_688;
  int local_684;
  undefined4 local_680;
  undefined4 local_67c;
  undefined4 local_678;
  long local_670;
  int local_664;
  int local_660;
  int local_65c;
  void **local_658;
  int local_64c;
  int local_648;
  int local_644;
  void *local_640;
  int *local_638;
  ulong local_630;
  undefined4 local_628;
  long *local_620;
  int local_618;
  int local_614;
  int local_610;
  undefined4 local_60c;
  undefined4 local_608;
  ulong local_600;
  void *local_5f8;
  int *local_5f0;
  void *local_5e8;
  undefined4 local_5e0;
  long *local_5d8;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined4 local_5c8;
  undefined4 local_5c4;
  undefined4 local_5c0;
  void *local_5b8;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  void *local_598;
  int *local_590;
  ulong local_588;
  undefined4 local_580;
  long *local_578;
  int local_570;
  int local_56c;
  int local_568;
  undefined4 local_564;
  int local_560;
  long local_558;
  undefined4 local_550;
  Mat local_540;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  void **local_4d0;
  Mat *local_4c8;
  long local_4c0;
  int local_4b4;
  void **local_4b0;
  void **local_4a8;
  void **local_4a0;
  undefined8 *local_490;
  Mat *local_480;
  void **local_470;
  void **local_460;
  void **local_450;
  void **local_440;
  Mat *local_430;
  void **local_420;
  Mat *local_418;
  undefined1 local_40d;
  int local_40c;
  Mat *local_408;
  undefined8 *local_400;
  undefined1 local_3ed;
  int local_3ec;
  void **local_3e8;
  void **local_3e0;
  undefined4 local_3d0;
  int local_3cc;
  undefined8 *local_3c8;
  void **local_3c0;
  int local_388;
  undefined4 local_384;
  Mat *local_380;
  int local_368;
  undefined4 local_364;
  void **local_360;
  int local_348;
  undefined4 local_344;
  void **local_340;
  int local_328;
  undefined4 local_324;
  void **local_320;
  int local_308;
  undefined4 local_304;
  void **local_300;
  Mat *local_2e0;
  undefined8 *local_2c0;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  void **local_290;
  void **local_288;
  void **local_280;
  int local_278;
  undefined4 local_274;
  void **local_270;
  Mat *local_268;
  void **local_260;
  long *local_258;
  undefined4 local_24c;
  ulong local_248;
  void *local_240;
  undefined4 local_234;
  int local_230;
  int local_22c;
  void **local_228;
  Allocator *local_220;
  int local_214;
  size_t local_210;
  void *local_208;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  undefined8 *local_1f0;
  undefined4 local_1e4;
  long local_1e0;
  undefined4 local_1d4;
  long local_1d0;
  Allocator *local_1c8;
  int local_1bc;
  size_t local_1b8;
  void *local_1b0;
  undefined4 local_1a8;
  int local_1a4;
  void **local_1a0;
  void *local_198;
  void *local_190;
  void *local_160;
  void *local_150;
  void *local_140;
  void *local_130;
  void *local_120;
  undefined1 local_fd;
  int local_fc;
  Mat *local_f0;
  Allocator *local_d0;
  int local_c4;
  size_t local_c0;
  void *local_b8;
  int local_ac;
  int local_a8;
  int local_a4;
  Mat *local_a0;
  undefined4 local_94;
  long local_90;
  undefined4 local_80;
  int local_7c;
  Mat *local_78;
  void **local_70;
  Allocator *local_68;
  int local_5c;
  size_t local_58;
  void *local_50;
  undefined4 local_48;
  int local_44;
  void **local_40;
  undefined8 local_38;
  undefined8 local_30;
  int local_20;
  int local_1c;
  Mat *local_18;
  
  if (in_stack_00000010 == 0) {
    if (*(int *)(in_RDI + 0x28) == 3) {
      local_794 = *(int *)(in_RDI + 0x38);
    }
    else {
      local_794 = *(int *)(in_RDI + 0x30);
    }
    local_790 = local_794 * *(int *)(in_RDI + 0x18);
  }
  else {
    local_790 = *(int *)(in_RDI + 0x2c);
  }
  local_4e4 = local_790;
  local_4e0 = in_R9D;
  local_4dc = in_R8D;
  local_4d0 = in_RDX;
  local_4c8 = in_RSI;
  local_4c0 = in_RDI;
  get_optimal_tile_mnk
            (in_stack_fffffffffffff774,in_stack_fffffffffffff770,in_stack_fffffffffffff76c,
             in_stack_fffffffffffff768,(int)((ulong)in_stack_fffffffffffff760 >> 0x20),
             (int)in_stack_fffffffffffff760,(int *)in_stack_fffffffffffff780,
             in_stack_fffffffffffff788,(int *)in_stack_fffffffffffff790,
             (int)in_stack_fffffffffffff798);
  local_4f4 = (local_4e4 + local_4e8 + -1) / local_4e8;
  local_1c = local_4f0 * local_4e8;
  local_20 = (in_stack_00000008 + local_4f0 + -1) / local_4f0;
  local_38 = *(undefined8 *)(in_stack_00000040 + 0x10);
  local_18 = &local_540;
  local_30 = 4;
  local_540.data = (void *)0x0;
  local_540.refcount = (int *)0x0;
  local_540.elemsize = 0;
  local_540.elempack = 0;
  local_540.allocator = (Allocator *)0x0;
  local_540.dims = 0;
  local_540.w = 0;
  local_540.h = 0;
  local_540.d = 0;
  local_540.c = 0;
  local_540.cstep = 0;
  Mat::create(in_stack_fffffffffffff720,in_stack_fffffffffffff71c,in_stack_fffffffffffff718,
              in_stack_fffffffffffff714,
              CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
              (Allocator *)CONCAT44(in_stack_fffffffffffff704,in_stack_00000038));
  local_418 = &local_540;
  if (local_540.data != (void *)0x0) {
    local_268 = local_418;
  }
  local_795 = local_540.data == (void *)0x0 || local_540.cstep * (long)local_540.c == 0;
  if (local_795) {
    local_4b4 = -100;
    local_550 = 1;
    goto LAB_0184aed7;
  }
  local_4b0 = &local_598;
  local_598 = (void *)0x0;
  local_590 = (int *)0x0;
  local_588 = 0;
  local_580 = 0;
  local_578 = (long *)0x0;
  local_570 = 0;
  local_56c = 0;
  local_568 = 0;
  local_564 = 0;
  local_560 = 0;
  local_558 = 0;
  if (((local_4f0 < in_stack_00000008) || (local_4dc == 3)) || (in_stack_00000018 != 0)) {
    Mat::create(in_stack_fffffffffffff720,in_stack_fffffffffffff71c,in_stack_fffffffffffff718,
                in_stack_fffffffffffff714,
                CONCAT44(in_stack_fffffffffffff70c,in_stack_fffffffffffff708),
                (Allocator *)CONCAT44(in_stack_fffffffffffff704,in_stack_00000038));
    local_420 = &local_598;
    if (local_598 != (void *)0x0) {
      local_260 = local_420;
    }
    if (local_598 != (void *)0x0 && local_558 * local_560 != 0) goto LAB_01848e6f;
    local_4b4 = -100;
  }
  else {
LAB_01848e6f:
    for (local_59c = 0; local_59c < local_4f4; local_59c = local_59c + 1) {
      local_5a0 = local_59c * local_4e8;
      if (in_stack_00000010 == 0) {
        if (*(int *)(local_4c0 + 0x28) == 3) {
          local_7d4 = *(int *)(local_4c0 + 0x38);
        }
        else {
          local_7d4 = *(int *)(local_4c0 + 0x30);
        }
        local_7d0 = local_7d4 * *(int *)(local_4c0 + 0x18);
      }
      else {
        local_7d0 = *(int *)(local_4c0 + 0x2c);
      }
      local_5a4 = local_7d0;
      if (in_stack_00000010 == 0) {
        local_7dc = *(int *)(local_4c0 + 0x2c);
      }
      else {
        if (*(int *)(local_4c0 + 0x28) == 3) {
          local_7d8 = *(int *)(local_4c0 + 0x38);
        }
        else {
          local_7d8 = *(int *)(local_4c0 + 0x30);
        }
        local_7dc = local_7d8 * *(int *)(local_4c0 + 0x18);
      }
      local_5a8 = local_7dc;
      local_5b0 = local_7d0 - local_5a0;
      piVar1 = std::min<int>(&local_5b0,&local_4e8);
      local_5ac = *piVar1;
      local_4a8 = &local_5f8;
      local_5f8 = (void *)0x0;
      local_5f0 = (int *)0x0;
      local_5e8 = (void *)0x0;
      local_5e0 = 0;
      local_5d8 = (long *)0x0;
      local_5d0 = 0;
      local_5cc = 0;
      local_5c8 = 0;
      local_5c4 = 0;
      local_5c0 = 0;
      local_5b8 = (void *)0x0;
      if (((local_4f0 < local_5a8) || (local_4dc == 3)) || (in_stack_00000018 != 0)) {
        local_3ec = get_omp_thread_num();
        local_3e0 = &local_640;
        local_3e8 = &local_598;
        local_240 = (void *)((long)local_598 + local_558 * local_3ec * local_588);
        local_228 = &local_640;
        local_640 = local_240;
        local_638 = (int *)0x0;
        local_630 = local_588;
        local_628 = local_580;
        local_620 = local_578;
        local_614 = local_56c;
        local_610 = local_568;
        local_60c = 1;
        local_608 = local_564;
        local_1d0 = (long)local_56c * (long)local_568 * local_588;
        local_600 = (local_1d0 + 0xfU & 0xfffffffffffffff0) / local_588;
        local_618 = local_570 + -1;
        if (local_570 == 4) {
          local_600 = (long)local_56c * (long)local_568;
        }
        local_1d4 = 0x10;
        local_22c = local_56c;
        local_230 = local_568;
        local_234 = local_564;
        local_248 = local_588;
        local_24c = local_580;
        local_258 = local_578;
        local_3ed = 1;
        local_290 = &local_640;
        local_288 = &local_5f8;
        if (&local_5f8 != local_290) {
          local_270 = &local_5f8;
          if (local_5f0 != (int *)0x0) {
            local_274 = 0xffffffff;
            LOCK();
            local_278 = *local_5f0;
            *local_5f0 = *local_5f0 + -1;
            UNLOCK();
            if (local_278 == 1) {
              if (local_5d8 == (long *)0x0) {
                local_198 = local_5f8;
                if (local_5f8 != (void *)0x0) {
                  free(local_5f8);
                }
              }
              else {
                (**(code **)(*local_5d8 + 0x18))(local_5d8,local_5f8);
              }
            }
          }
          local_5f8 = (void *)0x0;
          local_5e8 = (void *)0x0;
          local_5e0 = 0;
          local_5d0 = 0;
          local_5cc = 0;
          local_5c8 = 0;
          local_5c4 = 0;
          local_5c0 = 0;
          local_5b8 = (void *)0x0;
          local_5f0 = (int *)0x0;
          local_5f8 = *local_290;
          local_5f0 = (int *)local_290[1];
          local_5e8 = local_290[2];
          local_5e0 = *(undefined4 *)(local_290 + 3);
          local_5d8 = (long *)local_290[4];
          local_5d0 = *(undefined4 *)(local_290 + 5);
          local_5cc = *(undefined4 *)((long)local_290 + 0x2c);
          local_5c8 = *(undefined4 *)(local_290 + 6);
          local_5c4 = *(undefined4 *)((long)local_290 + 0x34);
          local_5c0 = *(undefined4 *)(local_290 + 7);
          local_5b8 = local_290[8];
        }
        local_4a0 = &local_640;
        local_2a0 = local_4a0;
        local_280 = &local_5f8;
        if (local_638 != (int *)0x0) {
          local_2a4 = 0xffffffff;
          LOCK();
          local_2a8 = *local_638;
          *local_638 = *local_638 + -1;
          UNLOCK();
          if (local_2a8 == 1) {
            if (local_620 == (long *)0x0) {
              local_190 = local_640;
              if (local_640 != (void *)0x0) {
                free(local_640);
              }
            }
            else {
              (**(code **)(*local_620 + 0x18))(local_620,local_640);
            }
          }
        }
        local_640 = (void *)0x0;
        local_630 = 0;
        local_628 = 0;
        local_618 = 0;
        local_614 = 0;
        local_610 = 0;
        local_60c = 0;
        local_608 = 0;
        local_600 = 0;
        local_638 = (int *)0x0;
      }
      for (local_644 = 0; local_644 < local_4e0; local_644 = local_4ec + local_644) {
        local_64c = local_4e0 - local_644;
        piVar1 = std::min<int>(&local_64c,&local_4ec);
        local_648 = *piVar1;
        if (local_4dc == 3) {
          pack_A_tile(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,
                      (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20),(int)in_stack_fffffffffffff7a8
                      ,(int)((ulong)in_stack_fffffffffffff7a0 >> 0x20),
                      (int)in_stack_fffffffffffff7a0);
        }
        if (local_4dc == 3) {
          local_830 = &local_5f8;
        }
        else {
          local_830 = local_4d0;
        }
        local_658 = local_830;
        for (local_65c = 0; local_65c < local_5a8; local_65c = local_4f0 + local_65c) {
          local_664 = local_5a8 - local_65c;
          piVar1 = std::min<int>(&local_664,&local_4f0);
          local_660 = *piVar1;
          local_40c = get_omp_thread_num();
          local_400 = &local_6f8;
          in_stack_fffffffffffff7b8 = &local_540;
          local_208 = (void *)((long)local_540.data +
                              local_540.cstep * (long)local_40c * local_540.elemsize);
          local_1f0 = &local_6f8;
          local_1e0 = (long)local_540.w * (long)local_540.h * local_540.elemsize;
          local_3cc = local_65c / local_4f0;
          local_3c0 = &local_6b0;
          local_3c8 = &local_6f8;
          local_1b0 = (void *)((long)local_208 +
                              (long)local_540.w * (long)local_3cc * local_540.elemsize);
          in_stack_fffffffffffff7a8 = &local_6b0;
          local_670 = (long)local_540.w;
          in_stack_fffffffffffff7a0 = &local_6f8;
          local_fc = local_644 / local_4ec;
          local_f0 = &local_788;
          local_a4 = local_4c8->w;
          local_a8 = local_4c8->h;
          local_ac = local_4c8->d;
          local_b8 = (void *)((long)local_4c8->data +
                             local_4c8->cstep * (long)local_fc * local_4c8->elemsize);
          local_c0 = local_4c8->elemsize;
          local_c4 = local_4c8->elempack;
          local_d0 = local_4c8->allocator;
          in_stack_fffffffffffff790 = &local_788;
          local_90 = (long)local_a4 * (long)local_a8 * local_c0;
          local_7c = local_65c / local_4f0;
          local_70 = &local_740;
          local_78 = &local_788;
          local_50 = (void *)((long)local_b8 + (long)local_a4 * (long)local_7c * local_c0);
          in_stack_fffffffffffff780 = &local_740;
          local_700 = (long)local_a4;
          local_480 = &local_788;
          local_678 = 1;
          local_67c = 1;
          local_680 = 1;
          local_684 = local_540.w;
          local_688 = 2;
          local_690 = local_540.allocator;
          local_698 = local_540.elempack;
          local_6a0 = local_540.elemsize;
          local_6a8 = (int *)0x0;
          local_6c0 = 0;
          local_6c4 = 0;
          local_6c8 = 0;
          local_6cc = 0;
          local_6d8 = local_540.allocator;
          local_6e0 = 0;
          local_6e8 = 0;
          local_6f0 = 0;
          local_6f8 = 0;
          local_708 = 1;
          local_70c = 1;
          local_710 = 1;
          local_718 = 2;
          local_738 = (int *)0x0;
          local_48 = 1;
          local_80 = 1;
          local_94 = 0x10;
          local_fd = 1;
          local_1a4 = local_540.w;
          local_1a8 = 1;
          local_1b8 = local_540.elemsize;
          local_1bc = local_540.elempack;
          local_1c8 = local_540.allocator;
          local_1e4 = 0x10;
          local_1f4 = local_540.w;
          local_1f8 = local_540.h;
          local_1fc = local_540.d;
          local_210 = local_540.elemsize;
          local_214 = local_540.elempack;
          local_220 = local_540.allocator;
          local_3d0 = 1;
          local_40d = 1;
          local_6b8 = 0;
          local_6d0 = 0;
          local_788.data = (void *)0x0;
          local_788.elemsize = 0;
          local_788.elempack = 0;
          local_788.dims = 0;
          local_788.w = 0;
          local_788.h = 0;
          local_788.d = 0;
          local_788.c = 0;
          local_788.cstep = 0;
          local_788.refcount = (int *)0x0;
          in_stack_fffffffffffff798 = local_4c8;
          local_490 = in_stack_fffffffffffff7a0;
          local_408 = in_stack_fffffffffffff7b8;
          local_2e0 = local_480;
          local_2c0 = in_stack_fffffffffffff7a0;
          local_1a0 = in_stack_fffffffffffff7a8;
          local_a0 = in_stack_fffffffffffff790;
          local_68 = local_d0;
          local_5c = local_c4;
          local_58 = local_c0;
          local_44 = local_a4;
          local_40 = in_stack_fffffffffffff780;
          local_788.allocator = local_d0;
          local_740 = local_50;
          local_730 = local_c0;
          local_728 = local_c4;
          local_720 = local_d0;
          local_714 = local_a4;
          local_6b0 = local_1b0;
          if (local_644 == 0) {
            k_00 = (int)((ulong)in_stack_fffffffffffff7a0 >> 0x20);
            i_00 = (int)((ulong)in_stack_fffffffffffff7a8 >> 0x20);
            if (in_stack_00000010 == 0) {
              pack_A_tile(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,i_00,
                          (int)in_stack_fffffffffffff7a8,k_00,(int)in_stack_fffffffffffff7a0);
            }
            else {
              transpose_pack_A_tile
                        (in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b0,i_00,
                         (int)in_stack_fffffffffffff7a8,k_00,(int)in_stack_fffffffffffff7a0);
            }
          }
          gemm_transB_packed_tile
                    (in_stack_00000260,in_stack_00000258,in_stack_00000250,in_stack_00000248,
                     in_stack_00000240,in_stack_0000023c,in_stack_00003df0,in_stack_00003df8,
                     in_stack_00003e00,in_stack_00003e08,in_stack_00003e10,in_stack_00003e18,
                     (bool)in_stack_0000023b);
          ppvVar2 = &local_740;
          local_470 = ppvVar2;
          local_300 = ppvVar2;
          if (local_738 != (int *)0x0) {
            local_304 = 0xffffffff;
            LOCK();
            local_308 = *local_738;
            *local_738 = *local_738 + -1;
            UNLOCK();
            if (local_308 == 1) {
              if (local_720 == (Allocator *)0x0) {
                local_160 = local_740;
                if (local_740 != (void *)0x0) {
                  free(local_740);
                }
              }
              else {
                (*local_720->_vptr_Allocator[3])(local_720,local_740);
              }
            }
          }
          *ppvVar2 = (void *)0x0;
          ppvVar2[2] = (void *)0x0;
          *(undefined4 *)(ppvVar2 + 3) = 0;
          *(undefined4 *)(ppvVar2 + 5) = 0;
          *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
          *(undefined4 *)(ppvVar2 + 6) = 0;
          *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
          *(undefined4 *)(ppvVar2 + 7) = 0;
          ppvVar2[8] = (void *)0x0;
          ppvVar2[1] = (void *)0x0;
          local_460 = &local_6b0;
          local_320 = local_460;
          if (local_6a8 != (int *)0x0) {
            local_324 = 0xffffffff;
            LOCK();
            local_328 = *local_6a8;
            *local_6a8 = *local_6a8 + -1;
            UNLOCK();
            if (local_328 == 1) {
              if (local_690 == (Allocator *)0x0) {
                local_150 = local_6b0;
                if (local_6b0 != (void *)0x0) {
                  free(local_6b0);
                }
              }
              else {
                (*local_690->_vptr_Allocator[3])(local_690,local_6b0);
              }
            }
          }
          local_6b0 = (void *)0x0;
          local_6a0 = 0;
          local_698 = 0;
          local_688 = 0;
          local_684 = 0;
          local_680 = 0;
          local_67c = 0;
          local_678 = 0;
          local_670 = 0;
          local_6a8 = (int *)0x0;
        }
        if (in_stack_00000018 != 0) {
          transpose_unpack_output_tile
                    (in_stack_fffffffffffff798,in_stack_fffffffffffff790,
                     (int)((ulong)in_stack_fffffffffffff788 >> 0x20),(int)in_stack_fffffffffffff788,
                     (int)((ulong)in_stack_fffffffffffff780 >> 0x20),(int)in_stack_fffffffffffff780)
          ;
        }
      }
      local_450 = &local_5f8;
      local_340 = local_450;
      if (local_5f0 != (int *)0x0) {
        local_344 = 0xffffffff;
        LOCK();
        local_348 = *local_5f0;
        *local_5f0 = *local_5f0 + -1;
        UNLOCK();
        if (local_348 == 1) {
          if (local_5d8 == (long *)0x0) {
            local_140 = local_5f8;
            if (local_5f8 != (void *)0x0) {
              free(local_5f8);
            }
          }
          else {
            (**(code **)(*local_5d8 + 0x18))(local_5d8,local_5f8);
          }
        }
      }
      local_5f8 = (void *)0x0;
      local_5e8 = (void *)0x0;
      local_5e0 = 0;
      local_5d0 = 0;
      local_5cc = 0;
      local_5c8 = 0;
      local_5c4 = 0;
      local_5c0 = 0;
      local_5b8 = (void *)0x0;
      local_5f0 = (int *)0x0;
    }
    local_4b4 = 0;
  }
  local_550 = 1;
  local_440 = &local_598;
  local_360 = local_440;
  if (local_590 != (int *)0x0) {
    local_364 = 0xffffffff;
    LOCK();
    local_368 = *local_590;
    *local_590 = *local_590 + -1;
    UNLOCK();
    if (local_368 == 1) {
      if (local_578 == (long *)0x0) {
        local_130 = local_598;
        if (local_598 != (void *)0x0) {
          free(local_598);
        }
      }
      else {
        (**(code **)(*local_578 + 0x18))(local_578,local_598);
      }
    }
  }
  local_598 = (void *)0x0;
  local_588 = 0;
  local_580 = 0;
  local_570 = 0;
  local_56c = 0;
  local_568 = 0;
  local_564 = 0;
  local_560 = 0;
  local_558 = 0;
  local_590 = (int *)0x0;
LAB_0184aed7:
  local_430 = &local_540;
  if (local_540.refcount != (int *)0x0) {
    local_384 = 0xffffffff;
    LOCK();
    local_388 = *local_540.refcount;
    *local_540.refcount = *local_540.refcount + -1;
    UNLOCK();
    if (local_388 == 1) {
      local_380 = local_430;
      if (local_540.allocator == (Allocator *)0x0) {
        local_120 = local_540.data;
        if (local_540.data != (void *)0x0) {
          free(local_540.data);
        }
      }
      else {
        (*(local_540.allocator)->_vptr_Allocator[3])(local_540.allocator,local_540.data);
      }
    }
  }
  return local_4b4;
}

Assistant:

static int gemm_BT_x86(const Mat& A, const Mat& BT, const Mat& C, Mat& top_blob, int broadcast_type_C, int N, int K, int transA, int output_transpose, int constant_TILE_M, int constant_TILE_N, int constant_TILE_K, int nT, const Option& opt)
{
    const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;

    // NCNN_LOGE("M/N/K = %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, nT);

    // NCNN_LOGE("TILE M/N/K = %d %d %d", TILE_M, TILE_N, TILE_K);

    int nn_M = (M + TILE_M - 1) / TILE_M;
    // int nn_N = (N + TILE_N - 1) / TILE_N;

    Mat ATX(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, nT, 4u, opt.workspace_allocator);
    if (ATX.empty())
        return -100;

    Mat topT;
    if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
    {
        topT.create(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
        if (topT.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(nT)
    for (int ppi = 0; ppi < nn_M; ppi++)
    {
        const int i = ppi * TILE_M;

        // shadowed variable for less openmp task args
        const int M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        const int K = transA ? (A.dims == 3 ? A.c : A.h) * A.elempack : A.w;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile;
        if (K > TILE_K || broadcast_type_C == 3 || output_transpose)
            topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            if (broadcast_type_C == 3)
            {
                pack_A_tile(C, topT_tile, i, max_ii, j, max_jj);
            }

            const Mat& CT_tile = broadcast_type_C == 3 ? topT_tile : C;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                // NCNN_LOGE("max_ii/jj/kk = %d %d %d", max_ii, max_jj, max_kk);

                Mat AT_tile = ATX.channel(get_omp_thread_num()).row_range(k / TILE_K, 1);

                Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                if (j == 0)
                {
                    if (transA)
                    {
                        transpose_pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                    else
                    {
                        pack_A_tile(A, AT_tile, i, max_ii, k, max_kk);
                    }
                }

                bool k_end = !output_transpose && k + TILE_K >= K;

                gemm_transB_packed_tile(AT_tile, BT_tile, CT_tile, topT_tile, top_blob, broadcast_type_C, i, max_ii, j, max_jj, k, max_kk, k_end);
            }

            if (output_transpose)
            {
                transpose_unpack_output_tile(topT_tile, top_blob, i, max_ii, j, max_jj);
            }
        }
    }

    return 0;
}